

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void print<vm::Instruction>(ostream *out,Instruction *t)

{
  bool bVar1;
  mapped_type *ppcVar2;
  pointer pvVar3;
  size_type sVar4;
  _Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
  local_28;
  const_iterator it;
  char *name;
  Instruction *t_local;
  ostream *out_local;
  
  ppcVar2 = std::
            unordered_map<vm::OpCode,_const_char_*,_std::hash<vm::OpCode>,_std::equal_to<vm::OpCode>,_std::allocator<std::pair<const_vm::OpCode,_const_char_*>_>_>
            ::at((unordered_map<vm::OpCode,_const_char_*,_std::hash<vm::OpCode>,_std::equal_to<vm::OpCode>,_std::allocator<std::pair<const_vm::OpCode,_const_char_*>_>_>
                  *)vm::nameOfOpCode,&t->op);
  it.
  super__Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
             )*ppcVar2;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<vm::OpCode,_std::vector<int,_std::allocator<int>_>,_std::hash<vm::OpCode>,_std::equal_to<vm::OpCode>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::find((unordered_map<vm::OpCode,_std::vector<int,_std::allocator<int>_>,_std::hash<vm::OpCode>,_std::equal_to<vm::OpCode>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)vm::paramSizeOfOpCode,&t->op);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<vm::OpCode,_std::vector<int,_std::allocator<int>_>,_std::hash<vm::OpCode>,_std::equal_to<vm::OpCode>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::end((unordered_map<vm::OpCode,_std::vector<int,_std::allocator<int>_>,_std::hash<vm::OpCode>,_std::equal_to<vm::OpCode>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)vm::paramSizeOfOpCode);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
                           *)&local_28);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&pvVar3->second);
    if (sVar4 == 0) {
      print<char_const*>(out,(char **)&it);
    }
    else if (sVar4 == 1) {
      print<char_const*,unsigned_int>(out,(char **)&it,&t->x);
    }
    else if (sVar4 == 2) {
      printfmt<char_const*,unsigned_int,unsigned_int>(out,"{} {},{}",(char **)&it,&t->x,&t->y);
    }
    else {
      print<char[5]>(out,(char (*) [5])0x13bd67);
    }
  }
  else {
    print<char_const*>(out,(char **)&it);
  }
  return;
}

Assistant:

inline void print(std::ostream& out, const vm::Instruction& t) {
    const char* name = vm::nameOfOpCode.at(t.op); 
    if (auto it = vm::paramSizeOfOpCode.find(t.op); it != vm::paramSizeOfOpCode.end()) {
        switch (it->second.size()) {
        case 0: print(out, name); break;
        case 1: print(out, name, t.x); break;
        case 2: printfmt(out, "{} {},{}", name, t.x, t.y); break;
        default: print(out, "????"); break;
        }
    }
    else {
        print(out, name);
    }
}